

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_class.cpp
# Opt level: O0

void __thiscall
pfederc::Parser::parseClassConstructor
          (Parser *this,bool *err,
          list<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>,_std::allocator<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>_>_>
          *constructAttributes)

{
  initializer_list<pfederc::Position> __l;
  bool bVar1;
  type pEVar2;
  tuple<pfederc::Expr_*,_std::default_delete<pfederc::Expr>_> this_00;
  Expr *pEVar3;
  pointer pEVar4;
  Token *this_01;
  Position *__args_3;
  Position *pos;
  pointer local_188;
  pointer local_158;
  allocator<pfederc::Position> local_119;
  Position local_118;
  Position *local_100;
  size_type local_f8;
  vector<pfederc::Position,_std::allocator<pfederc::Position>_> local_f0;
  undefined1 local_d8 [24];
  _List_node_base *local_c0;
  unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_> local_b8;
  iterator local_b0;
  const_iterator local_a8;
  undefined1 local_a0 [24];
  undefined1 local_88 [24];
  unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_> local_70;
  iterator local_68;
  const_iterator local_60;
  undefined1 local_58 [14];
  undefined2 local_4a;
  unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
  local_48;
  undefined1 local_40 [16];
  BiOpExpr *biopexpr;
  unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> expr;
  Token *constructStart;
  list<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>,_std::allocator<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>_>_>
  *constructAttributes_local;
  bool *err_local;
  Parser *this_local;
  
  expr._M_t.super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
  super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
  super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl =
       (__uniq_ptr_data<pfederc::Expr,_std::default_delete<pfederc::Expr>,_true,_true>)
       Lexer::getCurrentToken(this->lexer);
  Lexer::next(this->lexer);
  parseExpression((Parser *)&biopexpr,(Precedence)this);
  while( true ) {
    pEVar2 = std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::operator*
                       ((unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)&biopexpr)
    ;
    bVar1 = isBiOpExpr(pEVar2,TOK_OP_COMMA);
    if (!bVar1) {
      pEVar2 = std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::operator*
                         ((unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)
                          &biopexpr);
      bVar1 = isBiOpExpr(pEVar2,TOK_OP_DCL);
      if (bVar1) {
        local_b0._M_node =
             (_List_node_base *)
             std::__cxx11::
             list<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>,_std::allocator<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>_>_>
             ::begin(constructAttributes);
        std::
        _List_const_iterator<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>_>
        ::_List_const_iterator(&local_a8,&local_b0);
        pEVar4 = std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::release
                           ((unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)
                            &biopexpr);
        if (pEVar4 == (pointer)0x0) {
          local_188 = (pointer)0x0;
        }
        else {
          local_188 = (pointer)__dynamic_cast(pEVar4,&Expr::typeinfo,&BiOpExpr::typeinfo,0);
        }
        std::unique_ptr<pfederc::BiOpExpr,std::default_delete<pfederc::BiOpExpr>>::
        unique_ptr<std::default_delete<pfederc::BiOpExpr>,void>
                  ((unique_ptr<pfederc::BiOpExpr,std::default_delete<pfederc::BiOpExpr>> *)&local_b8
                   ,local_188);
        local_c0 = (_List_node_base *)
                   std::__cxx11::
                   list<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>,_std::allocator<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>_>_>
                   ::insert(constructAttributes,local_a8,(value_type *)&local_b8);
        std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>::~unique_ptr
                  (&local_b8);
      }
      else {
        local_a0._6_2_ = 2;
        local_a0._0_4_ = 9;
        pEVar4 = std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::operator->
                           ((unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)
                            &biopexpr);
        Expr::getPosition(pEVar4);
        std::
        make_unique<pfederc::Error<pfederc::SyntaxErrorCode>,pfederc::Level,pfederc::SyntaxErrorCode,pfederc::Position_const&>
                  ((Level *)(local_a0 + 8),(SyntaxErrorCode *)(local_a0 + 6),(Position *)local_a0);
        generateError((Parser *)(local_a0 + 0x10),
                      (unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                       *)this);
        std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::~unique_ptr
                  ((unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> *)
                   (local_a0 + 0x10));
        std::
        unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
        ::~unique_ptr((unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                       *)(local_a0 + 8));
      }
      bVar1 = expect(this,TOK_BRACKET_CLOSE);
      if (!bVar1) {
        local_d8._6_2_ = 2;
        local_d8._0_4_ = 1;
        this_01 = Lexer::getCurrentToken(this->lexer);
        __args_3 = Token::getPosition(this_01);
        pos = Token::getPosition((Token *)expr._M_t.
                                          super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>
                                          .super__Head_base<0UL,_pfederc::Expr_*,_false>.
                                          _M_head_impl);
        Position::Position(&local_118,pos);
        local_f8 = 1;
        local_100 = &local_118;
        std::allocator<pfederc::Position>::allocator(&local_119);
        __l._M_len = local_f8;
        __l._M_array = local_100;
        std::vector<pfederc::Position,_std::allocator<pfederc::Position>_>::vector
                  (&local_f0,__l,&local_119);
        std::
        make_unique<pfederc::Error<pfederc::SyntaxErrorCode>,pfederc::Level,pfederc::SyntaxErrorCode,pfederc::Position_const&,std::vector<pfederc::Position,std::allocator<pfederc::Position>>>
                  ((Level *)(local_d8 + 8),(SyntaxErrorCode *)(local_d8 + 6),(Position *)local_d8,
                   (vector<pfederc::Position,_std::allocator<pfederc::Position>_> *)__args_3);
        generateError((Parser *)(local_d8 + 0x10),
                      (unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                       *)this);
        std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::~unique_ptr
                  ((unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> *)
                   (local_d8 + 0x10));
        std::
        unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
        ::~unique_ptr((unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                       *)(local_d8 + 8));
        std::vector<pfederc::Position,_std::allocator<pfederc::Position>_>::~vector(&local_f0);
        std::allocator<pfederc::Position>::~allocator(&local_119);
      }
      std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::~unique_ptr
                ((unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)&biopexpr);
      return;
    }
    pEVar2 = std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::operator*
                       ((unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)&biopexpr)
    ;
    this_00.super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
    super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl =
         (_Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>)
         __dynamic_cast(pEVar2,&Expr::typeinfo,&BiOpExpr::typeinfo,0);
    if (this_00.super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
        super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl ==
        (_Head_base<0UL,_pfederc::Expr_*,_false>)0x0) break;
    local_40._8_8_ =
         this_00.super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
         super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl;
    pEVar3 = BiOpExpr::getRight((BiOpExpr *)
                                this_00.
                                super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>
                                .super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl);
    bVar1 = isBiOpExpr(pEVar3,TOK_OP_DCL);
    if (bVar1) {
      local_68._M_node =
           (_List_node_base *)
           std::__cxx11::
           list<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>,_std::allocator<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>_>_>
           ::begin(constructAttributes);
      std::
      _List_const_iterator<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>_>
      ::_List_const_iterator(&local_60,&local_68);
      BiOpExpr::getRightPtr((BiOpExpr *)(local_88 + 0x10));
      pEVar4 = std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::release
                         ((unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)
                          (local_88 + 0x10));
      if (pEVar4 == (pointer)0x0) {
        local_158 = (pointer)0x0;
      }
      else {
        local_158 = (pointer)__dynamic_cast(pEVar4,&Expr::typeinfo,&BiOpExpr::typeinfo,0);
      }
      std::unique_ptr<pfederc::BiOpExpr,std::default_delete<pfederc::BiOpExpr>>::
      unique_ptr<std::default_delete<pfederc::BiOpExpr>,void>
                ((unique_ptr<pfederc::BiOpExpr,std::default_delete<pfederc::BiOpExpr>> *)&local_70,
                 local_158);
      local_88._8_8_ =
           std::__cxx11::
           list<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>,_std::allocator<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>_>_>
           ::insert(constructAttributes,local_60,(value_type *)&local_70);
      std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>::~unique_ptr
                (&local_70);
      std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::~unique_ptr
                ((unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)(local_88 + 0x10)
                );
      BiOpExpr::getLeftPtr((BiOpExpr *)local_88);
      std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::operator=
                ((unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)&biopexpr,
                 (unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)local_88);
      std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::~unique_ptr
                ((unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)local_88);
    }
    else {
      local_4a = STX_ERR_EXPECTED_ARR_CLOSING_BRACKET;
      local_58._8_4_ = 9;
      pEVar3 = BiOpExpr::getRight((BiOpExpr *)local_40._8_8_);
      Expr::getPosition(pEVar3);
      std::
      make_unique<pfederc::Error<pfederc::SyntaxErrorCode>,pfederc::Level,pfederc::SyntaxErrorCode,pfederc::Position_const&>
                ((Level *)&local_48,(SyntaxErrorCode *)&local_4a,(Position *)(local_58 + 8));
      generateError((Parser *)local_40,
                    (unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                     *)this);
      std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::~unique_ptr
                ((unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> *)
                 local_40);
      std::
      unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
      ::~unique_ptr(&local_48);
      BiOpExpr::getLeftPtr((BiOpExpr *)local_58);
      std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::operator=
                ((unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)&biopexpr,
                 (unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)local_58);
      std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::~unique_ptr
                ((unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)local_58);
    }
  }
  __cxa_bad_cast();
}

Assistant:

void Parser::parseClassConstructor(bool &err,
    std::list<std::unique_ptr<BiOpExpr>> &constructAttributes) noexcept {
  const Token *const constructStart = lexer.getCurrentToken();
  lexer.next();

  std::unique_ptr<Expr> expr(parseExpression());
  while (isBiOpExpr(*expr, TokenType::TOK_OP_COMMA)) {
    BiOpExpr &biopexpr = dynamic_cast<BiOpExpr&>(*expr);
    if (!isBiOpExpr(biopexpr.getRight(), TokenType::TOK_OP_DCL)) {
      generateError(std::make_unique<SyntaxError>(LVL_ERROR,
        SyntaxErrorCode::STX_ERR_EXPECTED_VARDECL, biopexpr.getRight().getPosition()));
      // advance to next left expression
      expr = biopexpr.getLeftPtr();
      continue;
    }

    constructAttributes.insert(constructAttributes.begin(),
      std::unique_ptr<BiOpExpr>(
        dynamic_cast<BiOpExpr*>(biopexpr.getRightPtr().release())));
    // advance to next left expression
    expr = biopexpr.getLeftPtr();
  }

  if (!isBiOpExpr(*expr, TokenType::TOK_OP_DCL)) {
    generateError(std::make_unique<SyntaxError>(LVL_ERROR,
      SyntaxErrorCode::STX_ERR_EXPECTED_VARDECL, expr->getPosition()));
    // soft error
  } else {
    constructAttributes.insert(constructAttributes.begin(),
      std::unique_ptr<BiOpExpr>(
        dynamic_cast<BiOpExpr*>(expr.release())));
  }

  if (!expect(TokenType::TOK_BRACKET_CLOSE)) {
    generateError(std::make_unique<SyntaxError>(LVL_ERROR,
      SyntaxErrorCode::STX_ERR_EXPECTED_CLOSING_BRACKET,
      lexer.getCurrentToken()->getPosition(),
      std::vector<Position>{ constructStart->getPosition() }));
  }
}